

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O0

int float32_is_signaling_nan_tricore(float32 a_,float_status *status)

{
  flag fVar1;
  bool local_1d;
  uint32_t a;
  float_status *status_local;
  float32 a__local;
  
  fVar1 = snan_bit_is_one(status);
  if (fVar1 == '\0') {
    local_1d = (a_ >> 0x16 & 0x1ff) == 0x1fe && (a_ & 0x3fffff) != 0;
  }
  else {
    local_1d = 0xff7fffff < a_ << 1;
  }
  status_local._4_4_ = (uint)local_1d;
  return status_local._4_4_;
}

Assistant:

int float32_is_signaling_nan(float32 a_, float_status *status)
{
#ifdef NO_SIGNALING_NANS
    return 0;
#else
    uint32_t a = float32_val(a_);
    if (snan_bit_is_one(status)) {
        return ((uint32_t)(a << 1) >= 0xFF800000);
    } else {
        return (((a >> 22) & 0x1FF) == 0x1FE) && (a & 0x003FFFFF);
    }
#endif
}